

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFileSpecObjectHelper::getFilename_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFileSpecObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_69;
  uint local_68;
  QPDFObjectHandle k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  QPDFFileSpecObjectHelper *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&name_keys_abi_cxx11_);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&name_keys_abi_cxx11_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_69);
      std::allocator<char>::~allocator(&local_69);
      return __return_storage_ptr__;
    }
    k.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffa8);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&stack0xffffffffffffffb8,(string *)&stack0xffffffffffffffa8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffa8);
    bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&stack0xffffffffffffffb8);
    if (bVar1) {
      QPDFObjectHandle::getUTF8Value_abi_cxx11_
                (__return_storage_ptr__,(QPDFObjectHandle *)&stack0xffffffffffffffb8);
    }
    local_68 = (uint)bVar1;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffb8);
    if (local_68 != 0) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFileSpecObjectHelper::getFilename()
{
    for (auto const& i: name_keys) {
        auto k = oh().getKey(i);
        if (k.isString()) {
            return k.getUTF8Value();
        }
    }
    return "";
}